

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O3

void aalcalcmeanonly::DoIt(string *subFolder,bool skipHeader,bool ordOutput,string *parquetOutFile)

{
  int iVar1;
  string path;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  LoadPeriodToWeighting();
  LoadOccurrence();
  std::operator+(&local_48,"work/",subFolder);
  std::__cxx11::string::substr((ulong)local_68,(ulong)&local_48);
  iVar1 = std::__cxx11::string::compare((char *)local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  if (iVar1 != 0) {
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,local_48._M_dataplus._M_p,
               local_48._M_dataplus._M_p + local_48._M_string_length);
    std::__cxx11::string::append((char *)local_68);
    std::__cxx11::string::operator=((string *)&local_48,(string *)local_68);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0]);
    }
  }
  ReadFilesInDirectory(&local_48);
  OutputRows(skipHeader,ordOutput,parquetOutFile);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DoIt(const std::string& subFolder, const bool skipHeader,
	    const bool ordOutput, const std::string& parquetOutFile) {

    LoadPeriodToWeighting();
    LoadOccurrence();

    std::string path = "work/" + subFolder;
    if (path.substr(path.length() - 1, 1) != "/") {
      path = path + "/";
    }
    ReadFilesInDirectory(path);
    OutputRows(skipHeader, ordOutput, parquetOutFile);

  }